

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_to_line_spectral_pairs.cc
# Opt level: O2

bool __thiscall
sptk::LinearPredictiveCoefficientsToLineSpectralPairs::Run
          (LinearPredictiveCoefficientsToLineSpectralPairs *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *line_spectral_pairs,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  double dVar6;
  long lVar7;
  double *pdVar8;
  size_type sVar9;
  double *pdVar10;
  ulong uVar11;
  vector<double,_std::allocator<double>_> *coefficients;
  uint uVar12;
  int iVar13;
  bool bVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double x;
  double local_78;
  
  if (this->is_valid_ == true) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (line_spectral_pairs == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    lVar7 = (long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    sVar9 = lVar7 >> 3;
    if (sVar9 != (long)this->num_order_ + 1U) {
      return false;
    }
    if ((long)(line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar7) {
      std::vector<double,_std::allocator<double>_>::resize(line_spectral_pairs,sVar9);
    }
    this_00 = &buffer->c1_;
    sVar9 = (long)this->num_symmetric_polynomial_order_ + 1;
    if ((long)(buffer->c1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->c1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar9) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,sVar9);
    }
    this_01 = &buffer->c2_;
    sVar9 = (long)this->num_asymmetric_polynomial_order_ + 1;
    if ((long)(buffer->c2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->c2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar9) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,sVar9);
    }
    pdVar8 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar3 = *pdVar8;
    uVar11 = (ulong)this->num_order_;
    if (uVar11 == 0) {
      return true;
    }
    pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = this->num_symmetric_polynomial_order_;
    pdVar4[(int)uVar12] = 1.0;
    uVar2 = this->num_asymmetric_polynomial_order_;
    pdVar5[(int)uVar2] = 1.0;
    pdVar10 = pdVar8 + uVar11;
    pdVar8 = pdVar8 + 1;
    if ((uVar11 & 1) == 0) {
      for (uVar11 = (ulong)uVar12; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        pdVar4[uVar11 - 1] = (*pdVar8 + *pdVar10) - pdVar4[uVar11];
        pdVar5[uVar11 - 1] = (*pdVar8 - *pdVar10) + pdVar5[uVar11];
        pdVar8 = pdVar8 + 1;
        pdVar10 = pdVar10 + -1;
      }
      dVar22 = *pdVar4;
    }
    else {
      lVar7 = 0;
      while( true ) {
        dVar22 = *pdVar8 + pdVar10[lVar7];
        if ((int)(uVar2 + (int)lVar7) < 1) break;
        pdVar4[(ulong)uVar2 + lVar7] = dVar22;
        dVar22 = *pdVar8 - pdVar10[lVar7];
        if (lVar7 != 0) {
          dVar22 = dVar22 + pdVar5[(ulong)uVar2 + lVar7 + 1];
        }
        pdVar5[((int)lVar7 + uVar2) - 1] = dVar22;
        pdVar8 = pdVar8 + 1;
        lVar7 = lVar7 + -1;
      }
    }
    *pdVar4 = dVar22 * 0.5;
    *pdVar5 = *pdVar5 * 0.5;
    local_78 = anon_unknown.dwarf_99a1::CalculateChebyshevPolynomial(this_00,1.0);
    dVar19 = 1.0 / (double)this->num_split_;
    dVar20 = -1.0 - dVar19;
    coefficients = this_00;
    uVar11 = 0;
    dVar22 = 1.0;
    while( true ) {
      dVar16 = dVar22;
      dVar18 = local_78;
      dVar22 = dVar16 - dVar19;
      bVar14 = dVar20 < dVar22;
      if (dVar22 <= dVar20) break;
      local_78 = anon_unknown.dwarf_99a1::CalculateChebyshevPolynomial(coefficients,dVar22);
      if (local_78 * dVar18 <= 0.0) {
        iVar13 = this->num_iteration_;
        dVar1 = this->convergence_threshold_;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        iVar13 = iVar13 + 1;
        do {
          iVar13 = iVar13 + -1;
          dVar21 = dVar18;
          if (iVar13 == 0) break;
          x = (dVar22 + dVar16) * 0.5;
          dVar17 = anon_unknown.dwarf_99a1::CalculateChebyshevPolynomial(coefficients,x);
          dVar21 = dVar17;
          dVar6 = x;
          if (dVar18 * dVar17 <= 0.0) {
            dVar21 = dVar18;
            dVar6 = dVar16;
            local_78 = dVar17;
          }
          dVar16 = dVar6;
          uVar15 = -(ulong)(0.0 < dVar18 * dVar17);
          dVar22 = (double)(uVar15 & (ulong)dVar22 | ~uVar15 & (ulong)x);
          dVar18 = dVar21;
        } while (dVar1 < ABS(dVar17));
        dVar22 = (dVar16 * local_78 - dVar22 * dVar21) / (local_78 - dVar21);
        dVar18 = acos(dVar22);
        uVar12 = (int)uVar11 + 1;
        pdVar3[uVar11 + 1] = dVar18 / 6.283185307179586;
        if (this->num_order_ == uVar12) {
          return bVar14;
        }
        bVar14 = coefficients == this_00;
        coefficients = this_00;
        if (bVar14) {
          coefficients = this_01;
        }
        local_78 = anon_unknown.dwarf_99a1::CalculateChebyshevPolynomial(coefficients,dVar22);
        uVar11 = (ulong)uVar12;
      }
    }
  }
  return false;
}

Assistant:

bool LinearPredictiveCoefficientsToLineSpectralPairs::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* line_spectral_pairs,
    LinearPredictiveCoefficientsToLineSpectralPairs::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == line_spectral_pairs || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (line_spectral_pairs->size() != static_cast<std::size_t>(num_order_ + 1)) {
    line_spectral_pairs->resize(num_order_ + 1);
  }
  if (buffer->c1_.size() !=
      static_cast<std::size_t>(num_symmetric_polynomial_order_ + 1)) {
    buffer->c1_.resize(num_symmetric_polynomial_order_ + 1);
  }
  if (buffer->c2_.size() !=
      static_cast<std::size_t>(num_asymmetric_polynomial_order_ + 1)) {
    buffer->c2_.resize(num_asymmetric_polynomial_order_ + 1);
  }

  // Copy gain.
  (*line_spectral_pairs)[0] = linear_predictive_coefficients[0];
  if (0 == num_order_) return true;

  // Calculate symmetric and antisymmetric polynomials.
  double* c1(&buffer->c1_[0]);
  double* c2(&buffer->c2_[0]);
  {
    c1[num_symmetric_polynomial_order_] = 1.0;
    c2[num_asymmetric_polynomial_order_] = 1.0;
    const double* p1(&(linear_predictive_coefficients[0]) + 1);
    const double* p2(&(linear_predictive_coefficients[0]) + num_order_);
    if (num_order_ % 2 == 0) {
      for (int i(num_symmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i] = *p1 + *p2 - c1[i + 1];
        c2[i] = *p1 - *p2 + c2[i + 1];
      }
    } else {
      for (int i(num_asymmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i + 1] = *p1 + *p2;
        c2[i] = (i == num_asymmetric_polynomial_order_ - 1)
                    ? *p1 - *p2
                    : *p1 - *p2 + c2[i + 2];
      }
      c1[0] = *p1 + *p2;
    }
    c1[0] *= 0.5;
    c2[0] *= 0.5;
  }

  const std::vector<double>* c(&buffer->c1_);
  int order(0);
  double x_prev(1.0);
  double y_prev(CalculateChebyshevPolynomial(*c, x_prev));
  double* w(&((*line_spectral_pairs)[0]));

  // Search roots of polynomials.
  const double delta(1.0 / num_split_);
  const double x_max(1.0 - delta);
  const double x_min(-1.0 - delta);
  for (double x(x_max); x_min < x; x -= delta) {
    double y(CalculateChebyshevPolynomial(*c, x));

    if (y * y_prev <= 0.0) {
      double x_lower(x);
      double x_upper(x_prev);
      double y_lower(y);
      double y_upper(y_prev);

      for (int n(0); n < num_iteration_; ++n) {
        const double x_mid((x_lower + x_upper) * 0.5);
        const double y_mid(CalculateChebyshevPolynomial(*c, x_mid));

        if (y_mid * y_upper <= 0.0) {
          x_lower = x_mid;
          y_lower = y_mid;
        } else {
          x_upper = x_mid;
          y_upper = y_mid;
        }

        if (std::fabs(y_mid) <= convergence_threshold_) {
          break;
        }
      }

      const double x_interpolated((y_lower * x_upper - y_upper * x_lower) /
                                  (y_lower - y_upper));
      w[++order] = std::acos(x_interpolated) / sptk::kTwoPi;
      if (num_order_ == order) return true;

      // Update variables.
      c = (c == &buffer->c1_) ? &buffer->c2_ : &buffer->c1_;
      x = x_interpolated;
      y = CalculateChebyshevPolynomial(*c, x);
    }

    x_prev = x;
    y_prev = y;
  }

  return false;
}